

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
__thiscall
SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
operator&(SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
          *this,char rhs)

{
  uint local_18 [5];
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_4;
  
  local_18[0] = BinaryAndHelper<unsigned_int,_signed_char,_1>::And(0,'\0');
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt(&local_4,local_18);
  return (SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
          )local_4.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator &( U rhs ) const SAFEINT_NOTHROW
    {
        // we want to avoid setting bits by surprise
        // consider the case of lhs = int, value = 0xffffffff
        //                      rhs = char, value = 0xff
        //
        // programmer intent is to get only the lower 8 bits
        // normal behavior is to upcast both sides to an int
        // which then sign extends rhs, setting all the bits

        // If you land in the assert, this is because the bitwise operator
        // was causing unexpected behavior. Fix is to properly cast your inputs
        // so that it works like you meant, not unexpectedly

        return SafeInt< T, E >( BinaryAndHelper< T, U, BinaryMethod< T, U >::method >::And( m_int, rhs ) );
    }